

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPIChain.cpp
# Opt level: O0

ExchangeRequests * __thiscall
adios2::aggregator::MPIChain::IExchange(MPIChain *this,Buffer *buffer,int step)

{
  int in_ECX;
  unsigned_long __val;
  long in_RSI;
  ExchangeRequests *in_RDI;
  Buffer *receiveBuffer;
  Req receiveSizeRequest;
  size_t bufferSize;
  bool receiver;
  bool sender;
  int endRank;
  Buffer *sendBuffer;
  ExchangeRequests *requests;
  Req *pRVar1;
  Buffer *in_stack_fffffffffffffcf0;
  MPIChain *in_stack_fffffffffffffcf8;
  ExchangeRequests *in_stack_fffffffffffffd10;
  string *in_stack_fffffffffffffd18;
  Req *in_stack_fffffffffffffd20;
  undefined8 in_stack_fffffffffffffd38;
  int __val_00;
  bool local_291;
  string local_220 [16];
  int in_stack_fffffffffffffdf0;
  int in_stack_fffffffffffffdf4;
  size_t in_stack_fffffffffffffdf8;
  unsigned_long *in_stack_fffffffffffffe00;
  Comm *in_stack_fffffffffffffe08;
  string *in_stack_fffffffffffffe20;
  string local_1c0 [32];
  string local_1a0 [32];
  string local_180 [32];
  string local_160 [32];
  string local_140 [8];
  string *in_stack_fffffffffffffec8;
  Buffer *in_stack_fffffffffffffed0;
  size_t in_stack_fffffffffffffed8;
  MPIChain *in_stack_fffffffffffffee0;
  string local_f0 [32];
  Req local_d0 [5];
  string local_a8 [32];
  string local_88 [32];
  Req local_68 [5];
  undefined1 local_3f;
  byte local_3e;
  bool local_3d;
  int local_3c;
  Buffer *local_38;
  int local_1c;
  
  __val_00 = (int)((ulong)in_stack_fffffffffffffd38 >> 0x20);
  if (*(int *)(in_RSI + 0x2c) == 1) {
    helper::Comm::Req::Req((Req *)0xd7140b);
    helper::Comm::Req::Req((Req *)0xd71424);
    helper::Comm::Req::Req((Req *)0xd71437);
  }
  else {
    local_1c = in_ECX;
    local_38 = GetSender(in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
    local_3c = (*(int *)(in_RSI + 0x2c) + -1) - local_1c;
    local_291 = false;
    if (0 < *(int *)(in_RSI + 0x28)) {
      local_291 = *(int *)(in_RSI + 0x28) <= local_3c;
    }
    local_3d = local_291;
    local_3e = -(*(int *)(in_RSI + 0x28) < local_3c) & 1;
    local_3f = 0;
    ExchangeRequests::ExchangeRequests(in_stack_fffffffffffffd10);
    if ((local_3d & 1U) != 0) {
      std::__cxx11::to_string(__val_00);
      std::operator+((char *)in_stack_fffffffffffffcf8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffcf0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffcf8,(char *)in_stack_fffffffffffffcf0);
      pRVar1 = local_68;
      helper::Comm::Isend<unsigned_long>
                (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
                 in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0,in_stack_fffffffffffffe20);
      helper::Comm::Req::operator=((Req *)in_stack_fffffffffffffcf0,pRVar1);
      helper::Comm::Req::~Req((Req *)0xd7161f);
      std::__cxx11::string::~string((string *)local_68);
      std::__cxx11::string::~string(local_88);
      std::__cxx11::string::~string(local_a8);
      if (local_38->m_Position != 0) {
        __val_00 = (int)((ulong)(in_RSI + 0x20) >> 0x20);
        (*local_38->_vptr_Buffer[2])();
        std::__cxx11::to_string(__val_00);
        std::operator+((char *)in_stack_fffffffffffffcf8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffcf0);
        pRVar1 = local_d0;
        helper::Comm::Isend<char>
                  (in_stack_fffffffffffffe08,(char *)in_stack_fffffffffffffe00,
                   in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0,
                   in_stack_fffffffffffffe20);
        helper::Comm::Req::operator=((Req *)in_stack_fffffffffffffcf0,pRVar1);
        helper::Comm::Req::~Req((Req *)0xd71738);
        std::__cxx11::string::~string((string *)local_d0);
        std::__cxx11::string::~string(local_f0);
      }
    }
    if ((local_3e & 1) != 0) {
      __val = in_RSI + 0x20;
      std::__cxx11::to_string(__val_00);
      std::operator+((char *)in_stack_fffffffffffffcf8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffcf0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffcf8,(char *)in_stack_fffffffffffffcf0);
      helper::Comm::Irecv<unsigned_long>
                (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
                 in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0,in_stack_fffffffffffffe20);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffee0);
      std::__cxx11::string::~string(local_140);
      std::__cxx11::string::~string(local_160);
      std::__cxx11::to_string(__val_00);
      std::operator+((char *)in_stack_fffffffffffffcf8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffcf0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffcf8,(char *)in_stack_fffffffffffffcf0);
      helper::Comm::Req::Wait(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
      std::__cxx11::string::~string(local_180);
      std::__cxx11::string::~string(local_1a0);
      std::__cxx11::string::~string(local_1c0);
      GetReceiver(in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
      std::__cxx11::to_string(__val);
      std::operator+((char *)in_stack_fffffffffffffcf8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffcf0);
      ResizeUpdateBuffer(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                         in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffe00);
      std::__cxx11::string::~string(local_220);
      helper::Comm::Req::~Req((Req *)0xd71d51);
    }
  }
  return in_RDI;
}

Assistant:

MPIChain::ExchangeRequests MPIChain::IExchange(format::Buffer &buffer, const int step)
{
    if (m_Size == 1)
    {
        return {};
    }

    format::Buffer &sendBuffer = GetSender(buffer);
    const int endRank = m_Size - 1 - step;
    const bool sender = (m_Rank >= 1 && m_Rank <= endRank) ? true : false;
    const bool receiver = (m_Rank < endRank) ? true : false;

    ExchangeRequests requests;

    if (sender) // sender
    {
        requests.m_SendSize =
            m_Comm.Isend(&sendBuffer.m_Position, 1, m_Rank - 1, 0,
                         ", aggregation Isend size at iteration " + std::to_string(step) + "\n");

        // only send data if buffer larger than 0
        if (sendBuffer.m_Position > 0)
        {
            requests.m_SendData =
                m_Comm.Isend(sendBuffer.Data(), sendBuffer.m_Position, m_Rank - 1, 1,
                             ", aggregation Isend data at iteration " + std::to_string(step));
        }
    }
    // receive size, resize receiving buffer and receive data
    if (receiver)
    {
        size_t bufferSize = 0;
        helper::Comm::Req receiveSizeRequest =
            m_Comm.Irecv(&bufferSize, 1, m_Rank + 1, 0,
                         ", aggregation Irecv size at iteration " + std::to_string(step) + "\n");

        receiveSizeRequest.Wait(", aggregation waiting for receiver size at iteration " +
                                std::to_string(step) + "\n");

        format::Buffer &receiveBuffer = GetReceiver(buffer);
        ResizeUpdateBuffer(bufferSize, receiveBuffer,
                           "in aggregation, when resizing receiving buffer to size " +
                               std::to_string(bufferSize));

        // only receive data if buffer is larger than 0
        if (bufferSize > 0)
        {
            requests.m_RecvData =
                m_Comm.Irecv(receiveBuffer.Data(), receiveBuffer.m_Position, m_Rank + 1, 1,
                             ", aggregation Irecv data at iteration " + std::to_string(step));
        }
    }

    return requests;
}